

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacMessage.c
# Opt level: O2

HCOSE_RECIPIENT COSE_Mac_GetRecipient(HCOSE_MAC cose,int iRecipient,cose_errback *perr)

{
  _Bool _Var1;
  int iVar2;
  HCOSE_RECIPIENT p_Var3;
  bool bVar4;
  
  _Var1 = IsValidMacHandle(cose);
  if (_Var1) {
    p_Var3 = (HCOSE_RECIPIENT)(cose + 0x58);
    iVar2 = 0;
    if (0 < iRecipient) {
      iVar2 = iRecipient;
    }
    while( true ) {
      p_Var3 = *(HCOSE_RECIPIENT *)p_Var3;
      bVar4 = iVar2 == 0;
      iVar2 = iVar2 + -1;
      if (bVar4) break;
      if (p_Var3 == (HCOSE_RECIPIENT)0x0) {
        if (perr == (cose_errback *)0x0) {
          return (HCOSE_RECIPIENT)0x0;
        }
        perr->err = COSE_ERR_NO_RECIPIENT_FOUND;
        return (HCOSE_RECIPIENT)0x0;
      }
      p_Var3 = p_Var3 + 0x70;
    }
    if (p_Var3 != (HCOSE_RECIPIENT)0x0) {
      *(int *)(p_Var3 + 0x10) = *(int *)(p_Var3 + 0x10) + 1;
      return p_Var3;
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_PARAMETER;
  }
  return (HCOSE_RECIPIENT)0x0;
}

Assistant:

HCOSE_RECIPIENT COSE_Mac_GetRecipient(HCOSE_MAC cose, int iRecipient, cose_errback * perr)
{
	int i;
	COSE_RecipientInfo * p;

	CHECK_CONDITION(IsValidMacHandle(cose), COSE_ERR_INVALID_PARAMETER);

	p = ((COSE_MacMessage *)cose)->m_recipientFirst;
	for (i = 0; i < iRecipient; i++) {
		CHECK_CONDITION(p != NULL, COSE_ERR_NO_RECIPIENT_FOUND);
		p = p->m_recipientNext;
	}
	if (p != NULL) p->m_encrypt.m_message.m_refCount++;
	return (HCOSE_RECIPIENT)p;

errorReturn:
	return NULL;
}